

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtbl.c
# Opt level: O0

cf_void_t cf_hashtbl_delete(cf_hashtbl_t *self)

{
  hashtbl_node *phVar1;
  uint local_24;
  cf_uint32_t i;
  hashtbl_node_t *n;
  hashtbl_node_t *p;
  cf_hashtbl_t *self_local;
  
  if (self != (cf_hashtbl_t *)0x0) {
    for (local_24 = 0; local_24 < self->hashmsk + 1; local_24 = local_24 + 1) {
      n = self->table[local_24];
      if (n != (hashtbl_node_t *)0x0) {
        while (n != (hashtbl_node_t *)0x0) {
          phVar1 = n->next;
          if (n->key != (cf_void_t *)0x0) {
            free(n->key);
          }
          if (self->callback != (cf_hashtbl_cb_f)0x0) {
            (*self->callback)(n->value);
          }
          free(n);
          n = phVar1;
        }
      }
    }
    if (self->table != (hashtbl_node_t **)0x0) {
      free(self->table);
    }
    free(self);
  }
  return;
}

Assistant:

cf_void_t cf_hashtbl_delete(cf_hashtbl_t* self) {
    hashtbl_node_t* p, *n;
    cf_uint32_t i;
    if (CF_NULL_PTR == self) return ;

    /* destroy table items and apply callback */
    for (i = 0; i < self->hashmsk + 1; i++) {
        n = self->table[i]; 
        if (!n) continue;

        p = n;
        while (p) {
            n = p->next;
            if(p->key) {
                cf_free_native(p->key);
            }
            if (self->callback) {
                self->callback(p->value);
            }
            cf_free_native(p);
            p = n;
        }
    } 

    if (self->table) {
        cf_free_native(self->table);
    }
    cf_free_native(self);
}